

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

void __thiscall
s2polyline_alignment::Window::Window
          (Window *this,
          vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          *strides)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  ostream *poVar4;
  S2LogMessage local_68;
  S2LogMessageVoidify local_52;
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3e;
  byte local_3d;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  *local_18;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  *strides_local;
  Window *this_local;
  
  local_18 = strides;
  strides_local =
       (vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        *)this;
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  vector(&this->strides_);
  bVar1 = std::
          vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ::empty(local_18);
  local_3d = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x22,kFatal,(ostream *)&std::cerr);
    local_3d = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: !strides.empty() ");
    poVar4 = std::operator<<(poVar4,"Cannot construct empty window.");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
  }
  if ((local_3d & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  pvVar2 = std::
           vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
           ::operator[](local_18,0);
  local_51 = 0;
  if (pvVar2->start != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x23,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar4 = S2LogMessage::stream(&local_50);
    poVar4 = std::operator<<(poVar4,"Check failed: strides[0].start == 0 ");
    poVar4 = std::operator<<(poVar4,"First element of start_cols is non-zero.");
    S2LogMessageVoidify::operator&(&local_3e,poVar4);
  }
  if ((local_51 & 1) == 0) {
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::operator=(&this->strides_,local_18);
    sVar3 = std::
            vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
            ::size(local_18);
    this->rows_ = (int)sVar3;
    pvVar2 = std::
             vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ::back(local_18);
    this->cols_ = pvVar2->end;
    bVar1 = IsValid(this);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                 ,0x27,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_68);
      poVar4 = std::operator<<(poVar4,"Check failed: this->IsValid() ");
      poVar4 = std::operator<<(poVar4,"Constructor validity check fail.");
      S2LogMessageVoidify::operator&(&local_52,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
}

Assistant:

Window::Window(const std::vector<ColumnStride>& strides) {
  S2_DCHECK(!strides.empty()) << "Cannot construct empty window.";
  S2_DCHECK(strides[0].start == 0) << "First element of start_cols is non-zero.";
  strides_ = strides;
  rows_ = strides.size();
  cols_ = strides.back().end;
  S2_DCHECK(this->IsValid()) << "Constructor validity check fail.";
}